

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

char * glfwGetKeyName(int key,int scancode)

{
  int local_18;
  int scancode_local;
  int key_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    _scancode_local = (char *)0x0;
  }
  else {
    local_18 = scancode;
    if (key != -1) {
      if (((key != 0x150) && ((key < 0x140 || (0x14e < key)))) && ((key < 0x27 || (0xa2 < key)))) {
        return (char *)0x0;
      }
      local_18 = _glfwPlatformGetKeyScancode(key);
    }
    _scancode_local = _glfwPlatformGetScancodeName(local_18);
  }
  return _scancode_local;
}

Assistant:

GLFWAPI const char* glfwGetKeyName(int key, int scancode)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (key != GLFW_KEY_UNKNOWN)
    {
        if (key != GLFW_KEY_KP_EQUAL &&
            (key < GLFW_KEY_KP_0 || key > GLFW_KEY_KP_ADD) &&
            (key < GLFW_KEY_APOSTROPHE || key > GLFW_KEY_WORLD_2))
        {
            return NULL;
        }

        scancode = _glfwPlatformGetKeyScancode(key);
    }

    return _glfwPlatformGetScancodeName(scancode);
}